

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanTests.cpp
# Opt level: O0

int testSpanTestsIteratorMutable(void)

{
  initializer_list<unsigned_int> __l;
  iterator ptVar1;
  ostream *poVar2;
  reference puVar3;
  Span<unsigned_int,_18446744073709551615UL> *pSVar4;
  Span<unsigned_int,_18446744073709551615UL> SVar5;
  type_conflict3 *i;
  iterator __end1;
  iterator __begin1;
  Span<unsigned_int,_18446744073709551615UL> *__range1;
  size_t counter;
  Span<unsigned_int,_18446744073709551615UL> span;
  allocator<unsigned_int> local_49;
  uint local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<unsigned_int>::allocator(&local_49);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28,__l,&local_49);
  std::allocator<unsigned_int>::~allocator(&local_49);
  SVar5 = MILBlob::Util::MakeSpan<unsigned_int,_std::vector,_std::allocator<unsigned_int>_>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
  span.m_ptr = (pointer)SVar5.m_size.m_size;
  counter = (size_t)SVar5.m_ptr;
  __range1 = (Span<unsigned_int,_18446744073709551615UL> *)0x0;
  __end1 = MILBlob::Util::Span<unsigned_int,_18446744073709551615UL>::begin
                     ((Span<unsigned_int,_18446744073709551615UL> *)&counter);
  ptVar1 = MILBlob::Util::Span<unsigned_int,_18446744073709551615UL>::end
                     ((Span<unsigned_int,_18446744073709551615UL> *)&counter);
  do {
    if (__end1 == ptVar1) {
      if (__range1 == (Span<unsigned_int,_18446744073709551615UL> *)0x4) {
        values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x177);
        poVar2 = std::operator<<(poVar2,": error: ");
        poVar2 = std::operator<<(poVar2,"(counter) == (size_t(4))");
        poVar2 = std::operator<<(poVar2," was false, expected true.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
LAB_001c225d:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_28);
      return values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    pSVar4 = (Span<unsigned_int,_18446744073709551615UL> *)((long)&__range1->m_ptr + 1);
    if ((Span<unsigned_int,_18446744073709551615UL> *)(ulong)*__end1 != pSVar4) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x172);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(i) == (++counter)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_001c225d;
    }
    *__end1 = *__end1 + 1;
    if ((undefined1 *)(ulong)*__end1 != (undefined1 *)((long)&__range1->m_ptr + 2U)) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x174);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(i) == (counter + 1)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_001c225d;
    }
    puVar3 = MILBlob::Util::Span<unsigned_int,_18446744073709551615UL>::operator[]
                       ((Span<unsigned_int,_18446744073709551615UL> *)&counter,(size_t)__range1);
    if (*puVar3 != *__end1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/SpanTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x175);
      poVar2 = std::operator<<(poVar2,": error: ");
      poVar2 = std::operator<<(poVar2,"(span[counter - 1]) == (i)");
      poVar2 = std::operator<<(poVar2," was false, expected true.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_001c225d;
    }
    __end1 = __end1 + 1;
    __range1 = pSVar4;
  } while( true );
}

Assistant:

int testSpanTestsIteratorMutable()
{
    std::vector<uint32_t> values = {1, 2, 3, 4};
    auto span = MakeSpan(values);

    size_t counter = 0;
    for (auto& i : span) {
        ML_ASSERT_EQ(i, ++counter);
        i++;
        ML_ASSERT_EQ(i, counter + 1);
        ML_ASSERT_EQ(span[counter - 1], i);
    }
    ML_ASSERT_EQ(counter, size_t(4));

    return 0;
}